

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O2

void Psr_ManPrintModules(Psr_Man_t *p)

{
  Abc_Nam_t *pAVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  
  printf("Succeeded parsing %d models:\n",(ulong)(uint)(p->vSucceeded).nSize);
  for (iVar4 = 0; iVar4 < (p->vSucceeded).nSize; iVar4 = iVar4 + 1) {
    pAVar1 = p->pStrs;
    iVar2 = Vec_IntEntry(&p->vSucceeded,iVar4);
    pcVar3 = Abc_NamStr(pAVar1,iVar2);
    if (pcVar3 == (char *)0x0) break;
    printf(" %s",pcVar3);
  }
  putchar(10);
  printf("Skipped %d known models:\n",(ulong)(uint)(p->vKnown).nSize);
  for (iVar4 = 0; iVar4 < (p->vKnown).nSize; iVar4 = iVar4 + 1) {
    pAVar1 = p->pStrs;
    iVar2 = Vec_IntEntry(&p->vKnown,iVar4);
    pcVar3 = Abc_NamStr(pAVar1,iVar2);
    if (pcVar3 == (char *)0x0) break;
    printf(" %s",pcVar3);
  }
  putchar(10);
  printf("Skipped %d failed models:\n",(ulong)(uint)(p->vFailed).nSize);
  for (iVar4 = 0; iVar4 < (p->vFailed).nSize; iVar4 = iVar4 + 1) {
    pAVar1 = p->pStrs;
    iVar2 = Vec_IntEntry(&p->vFailed,iVar4);
    pcVar3 = Abc_NamStr(pAVar1,iVar2);
    if (pcVar3 == (char *)0x0) break;
    printf(" %s",pcVar3);
  }
  putchar(10);
  return;
}

Assistant:

void Psr_ManPrintModules( Psr_Man_t * p )
{
    char * pName; int i; 
    printf( "Succeeded parsing %d models:\n", Vec_IntSize(&p->vSucceeded) );
    Psr_ManForEachNameVec( &p->vSucceeded, p, pName, i )
        printf( " %s", pName );
    printf( "\n" );
    printf( "Skipped %d known models:\n", Vec_IntSize(&p->vKnown) );
    Psr_ManForEachNameVec( &p->vKnown, p, pName, i )
        printf( " %s", pName );
    printf( "\n" );
    printf( "Skipped %d failed models:\n", Vec_IntSize(&p->vFailed) );
    Psr_ManForEachNameVec( &p->vFailed, p, pName, i )
        printf( " %s", pName );
    printf( "\n" );
}